

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O3

uint crnlib::utils::compute_max_mips(uint width,uint height)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  
  uVar1 = height | width;
  if (1 < uVar1) {
    uVar1 = 1;
    do {
      uVar1 = uVar1 + 1;
      bVar2 = 3 < width;
      bVar3 = 3 < height;
      width = width >> 1;
      height = height >> 1;
    } while (bVar3 || bVar2);
  }
  return uVar1;
}

Assistant:

uint compute_max_mips(uint width, uint height)
        {
            if ((width | height) == 0)
            {
                return 0;
            }

            uint num_mips = 1;

            while ((width > 1U) || (height > 1U))
            {
                width >>= 1U;
                height >>= 1U;
                num_mips++;
            }

            return num_mips;
        }